

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs.cpp
# Opt level: O0

void CorUnix::PALCS_ReportStatisticalData(void)

{
  return;
}

Assistant:

void PALCS_ReportStatisticalData()
    {
#ifdef PAL_TRACK_CRITICAL_SECTIONS_DATA
        CPalThread * pThread = InternalGetCurrentThread();

        if (NULL == pThread) DebugBreak();

        // Take the lock for the global list of CS debug infos
        InternalEnterCriticalSection(pThread, (CRITICAL_SECTION*)&g_csPALCSsListLock);

        LONG lPALCSInitializeCount         = g_lPALCSInitializeCount;
        LONG lPALCSDeleteCount             = g_lPALCSDeleteCount;
        LONG lPALCSAcquireCount            = g_lPALCSAcquireCount;
        LONG lPALCSEnterCount              = g_lPALCSEnterCount;
        LONG lPALCSContentionCount         = g_lPALCSContentionCount;
        LONG lPALCSInternalInitializeCount = g_lPALCSInternalInitializeCount;
        LONG lPALCSInternalDeleteCount     = g_lPALCSInternalDeleteCount;
        LONG lPALCSInternalAcquireCount    = g_lPALCSInternalAcquireCount;
        LONG lPALCSInternalEnterCount      = g_lPALCSInternalEnterCount;
        LONG lPALCSInternalContentionCount = g_lPALCSInternalContentionCount;

        PLIST_ENTRY pItem = g_PALCSList.Flink;
        while (&g_PALCSList != pItem)
        {
            PCRITICAL_SECTION_DEBUG_INFO pDebugInfo =
                (PCRITICAL_SECTION_DEBUG_INFO)pItem;

            if (pDebugInfo->pOwnerCS->fInternal)
            {
                lPALCSInternalAcquireCount    += pDebugInfo->lAcquireCount;
                lPALCSInternalEnterCount      += pDebugInfo->lEnterCount;
                lPALCSInternalContentionCount += pDebugInfo->lContentionCount;
            }
            else
            {
                lPALCSAcquireCount            += pDebugInfo->lAcquireCount;
                lPALCSEnterCount              += pDebugInfo->lEnterCount;
                lPALCSContentionCount         += pDebugInfo->lContentionCount;
            }

            pItem = pItem->Flink;
        }

        // Release the lock for the global list of CS debug infos
        InternalLeaveCriticalSection(pThread, (CRITICAL_SECTION*)&g_csPALCSsListLock);

        TRACE("Critical Sections Statistical Data:\n");
        TRACE("{\n");
        TRACE("    Client code CSs:\n");
        TRACE("    {\n");
        TRACE("        Initialize Count: %d\n", lPALCSInitializeCount);
        TRACE("        Delete Count:     %d\n", lPALCSDeleteCount);
        TRACE("        Acquire Count:    %d\n", lPALCSAcquireCount);
        TRACE("        Enter Count:      %d\n", lPALCSEnterCount);
        TRACE("        Contention Count: %d\n", lPALCSContentionCount);
        TRACE("    }\n");
        TRACE("    Internal PAL CSs:\n");
        TRACE("    {\n");
        TRACE("        Initialize Count: %d\n", lPALCSInternalInitializeCount);
        TRACE("        Delete Count:     %d\n", lPALCSInternalDeleteCount);
        TRACE("        Acquire Count:    %d\n", lPALCSInternalAcquireCount);
        TRACE("        Enter Count:      %d\n", lPALCSInternalEnterCount);
        TRACE("        Contention Count: %d\n", lPALCSInternalContentionCount);
        TRACE("    }\n");
        TRACE("}\n");
#endif // PAL_TRACK_CRITICAL_SECTIONS_DATA
    }